

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O2

void __thiscall
duckdb::HistogramBinState<bool>::InitializeBins<duckdb::HistogramFunctor>
          (HistogramBinState<bool> *this,Vector *bin_vector,idx_t count,idx_t pos,
          AggregateInputData *aggr_input)

{
  size_type __n;
  long lVar1;
  vector<bool,_std::allocator<bool>_> *this_00;
  unsafe_vector<bool> *puVar2;
  unsafe_vector<idx_t> *puVar3;
  ulong uVar4;
  UnifiedVectorFormat *pUVar5;
  BinderException *pBVar6;
  ulong uVar7;
  size_type sVar8;
  bool bVar9;
  reference rVar10;
  reference rVar11;
  allocator local_e1;
  UnifiedVectorFormat bin_child_data;
  long local_d8;
  long local_d0;
  string local_98 [32];
  UnifiedVectorFormat bin_data;
  long local_70;
  long local_68;
  
  puVar2 = (unsafe_vector<bool> *)operator_new(0x28);
  (puVar2->super_vector<bool,_std::allocator<bool>_>).super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = 0;
  *(undefined8 *)
   ((long)&(puVar2->super_vector<bool,_std::allocator<bool>_>).
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
           super__Bit_iterator_base + 8) = 0;
  (puVar2->super_vector<bool,_std::allocator<bool>_>).super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(undefined8 *)
   ((long)&(puVar2->super_vector<bool,_std::allocator<bool>_>).
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
           super__Bit_iterator_base + 8) = 0;
  (puVar2->super_vector<bool,_std::allocator<bool>_>).super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  this->bin_boundaries = puVar2;
  puVar3 = (unsafe_vector<idx_t> *)operator_new(0x18);
  (puVar3->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (puVar3->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (puVar3->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->counts = puVar3;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&bin_data);
  duckdb::Vector::ToUnifiedFormat((ulong)bin_vector,(UnifiedVectorFormat *)count);
  if (*_bin_data != 0) {
    pos = (idx_t)*(uint *)(*_bin_data + pos * 4);
  }
  uVar7 = *(ulong *)(local_70 + pos * 0x10);
  __n = *(size_type *)(local_70 + 8 + pos * 0x10);
  if ((local_68 != 0) && ((*(ulong *)(local_68 + (pos >> 6) * 8) >> (pos & 0x3f) & 1) == 0)) {
    pBVar6 = (BinderException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&bin_child_data,"Histogram bin list cannot be NULL",(allocator *)local_98);
    duckdb::BinderException::BinderException(pBVar6,(string *)&bin_child_data);
    __cxa_throw(pBVar6,&BinderException::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar4 = duckdb::ListVector::GetEntry(bin_vector);
  pUVar5 = (UnifiedVectorFormat *)duckdb::ListVector::GetListSize(bin_vector);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&bin_child_data);
  duckdb::Vector::ToUnifiedFormat(uVar4,pUVar5);
  std::vector<bool,_std::allocator<bool>_>::reserve
            (&this->bin_boundaries->super_vector<bool,_std::allocator<bool>_>,__n);
  sVar8 = __n;
  while( true ) {
    bVar9 = sVar8 == 0;
    sVar8 = sVar8 - 1;
    if (bVar9) {
      puVar2 = this->bin_boundaries;
      std::__sort<std::_Bit_iterator,__gnu_cxx::__ops::_Iter_less_iter>
                ((puVar2->super_vector<bool,_std::allocator<bool>_>).
                 super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                 _M_start.super__Bit_iterator_base._M_p,0,
                 (puVar2->super_vector<bool,_std::allocator<bool>_>).
                 super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                 _M_finish.super__Bit_iterator_base._M_p,
                 *(uint *)((long)&(puVar2->super_vector<bool,_std::allocator<bool>_>).
                                  super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8));
      for (uVar7 = 1; this_00 = &this->bin_boundaries->super_vector<bool,_std::allocator<bool>_>,
          uVar7 < (ulong)(this_00->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                  ((long)(this_00->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                  (long)(this_00->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
          uVar7 = uVar7 + 1) {
        rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,uVar7 - 1);
        rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&this->bin_boundaries->super_vector<bool,_std::allocator<bool>_>,uVar7);
        if (((*rVar10._M_p & rVar10._M_mask) != 0) != ((*rVar11._M_p & rVar11._M_mask) == 0)) {
          vector<bool,_false>::unsafe_erase_at(this->bin_boundaries,uVar7);
          uVar7 = uVar7 - 1;
        }
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (&this->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>,__n + 1)
      ;
      UnifiedVectorFormat::~UnifiedVectorFormat(&bin_child_data);
      UnifiedVectorFormat::~UnifiedVectorFormat(&bin_data);
      return;
    }
    lVar1 = *_bin_child_data;
    uVar4 = uVar7;
    if (lVar1 != 0) {
      uVar4 = (ulong)*(uint *)(lVar1 + uVar7 * 4);
    }
    if ((local_d0 != 0) && ((*(ulong *)(local_d0 + (uVar4 >> 6) * 8) >> (uVar4 & 0x3f) & 1) == 0))
    break;
    uVar4 = uVar7;
    if (lVar1 != 0) {
      uVar4 = (ulong)*(uint *)(lVar1 + uVar7 * 4);
    }
    std::vector<bool,_std::allocator<bool>_>::push_back
              (&this->bin_boundaries->super_vector<bool,_std::allocator<bool>_>,
               *(bool *)(local_d8 + uVar4));
    uVar7 = uVar7 + 1;
  }
  pBVar6 = (BinderException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string(local_98,"Histogram bin entry cannot be NULL",&local_e1);
  duckdb::BinderException::BinderException(pBVar6,local_98);
  __cxa_throw(pBVar6,&BinderException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void InitializeBins(Vector &bin_vector, idx_t count, idx_t pos, AggregateInputData &aggr_input) {
		bin_boundaries = new unsafe_vector<T>();
		counts = new unsafe_vector<idx_t>();
		UnifiedVectorFormat bin_data;
		bin_vector.ToUnifiedFormat(count, bin_data);
		auto bin_counts = UnifiedVectorFormat::GetData<list_entry_t>(bin_data);
		auto bin_index = bin_data.sel->get_index(pos);
		auto bin_list = bin_counts[bin_index];
		if (!bin_data.validity.RowIsValid(bin_index)) {
			throw BinderException("Histogram bin list cannot be NULL");
		}

		auto &bin_child = ListVector::GetEntry(bin_vector);
		auto bin_count = ListVector::GetListSize(bin_vector);
		UnifiedVectorFormat bin_child_data;
		auto extra_state = OP::CreateExtraState(bin_count);
		OP::PrepareData(bin_child, bin_count, extra_state, bin_child_data);

		bin_boundaries->reserve(bin_list.length);
		for (idx_t i = 0; i < bin_list.length; i++) {
			auto bin_child_idx = bin_child_data.sel->get_index(bin_list.offset + i);
			if (!bin_child_data.validity.RowIsValid(bin_child_idx)) {
				throw BinderException("Histogram bin entry cannot be NULL");
			}
			bin_boundaries->push_back(OP::template ExtractValue<T>(bin_child_data, bin_list.offset + i, aggr_input));
		}
		// sort the bin boundaries
		std::sort(bin_boundaries->begin(), bin_boundaries->end());
		// ensure there are no duplicate bin boundaries
		for (idx_t i = 1; i < bin_boundaries->size(); i++) {
			if (Equals::Operation((*bin_boundaries)[i - 1], (*bin_boundaries)[i])) {
				bin_boundaries->erase_at(i);
				i--;
			}
		}

		counts->resize(bin_list.length + 1);
	}